

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec_utils.c
# Opt level: O3

apprun_exec_args_t * apprun_adjusted_exec_args(char *filename,char **argv,char **envp)

{
  _Bool _Var1;
  char *filename_00;
  char *appdir;
  apprun_exec_args_t *paVar2;
  char *shebang;
  char **ppcVar3;
  
  filename_00 = apprun_redirect_path(filename);
  appdir = getenv("APPRUN_STARTUP_APPDIR");
  paVar2 = apprun_duplicate_exec_args(filename_00,argv);
  shebang = apprun_read_shebang(filename_00);
  if (appdir != (char *)0x0) {
    _Var1 = apprun_shebang_requires_external_executable(shebang,appdir);
    if (!_Var1) {
      _Var1 = apprun_is_path_child_of(filename_00,appdir);
      if (!_Var1) {
        _Var1 = apprun_is_module_path(filename_00);
        if (!_Var1) goto LAB_001049ef;
      }
      ppcVar3 = apprun_set_original_workdir_env(envp);
      paVar2->envp = ppcVar3;
      apprun_chdir_to_runtime();
      goto LAB_00104a29;
    }
  }
LAB_001049ef:
  ppcVar3 = apprun_export_envp(envp);
  paVar2->envp = ppcVar3;
LAB_00104a29:
  if (shebang != (char *)0x0) {
    free(shebang);
  }
  free(filename_00);
  return paVar2;
}

Assistant:

apprun_exec_args_t* apprun_adjusted_exec_args(const char* filename, char* const* argv, char* const* envp) {
    char* resolved_filename = apprun_redirect_path(filename);
    char* appdir = getenv(APPRUN_ENV_STARTUP_PREFIX"APPDIR");

#ifdef DEBUG
    fprintf(stderr, "APPRUN_HOOK_DEBUG: APPDIR: %s\n", appdir);
    fprintf(stderr, "APPRUN_HOOK_DEBUG: ORIGINAL EXEC_ARGS\n");
    apprun_print_exec_args(resolved_filename, argv, envp);
#endif

    apprun_exec_args_t* res = NULL;
    res = apprun_duplicate_exec_args(resolved_filename, argv);

    char* shebang = apprun_read_shebang(resolved_filename);
    if (appdir != NULL &&
        !apprun_shebang_requires_external_executable(shebang, appdir) &&
        (apprun_is_path_child_of(resolved_filename, appdir) || apprun_is_module_path(resolved_filename))) {
#ifdef DEBUG
        fprintf(stderr, "APPRUN_HOOK_DEBUG: USING BUNDLE RUNTIME\n");
#endif
        res->envp = apprun_set_original_workdir_env(envp);
        apprun_chdir_to_runtime();
    } else {
#ifdef DEBUG
        fprintf(stderr, "APPRUN_HOOK_DEBUG: USING SYSTEM RUNTIME\n");
#endif
        res->envp = apprun_export_envp(envp);
    }

#ifdef DEBUG
    fprintf(stderr, "APPRUN_HOOK_DEBUG: APPDIR: %s\n", appdir);
    fprintf(stderr, "APPRUN_HOOK_DEBUG: REAL EXEC_ARGS\n");
    apprun_print_exec_args(res->file, res->args, res->envp);
#endif

    if (shebang != NULL)
        free(shebang);

    free(resolved_filename);
    return res;
}